

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O0

void __thiscall Logger::Impl::Impl(Impl *this,char *fileName,int line)

{
  char *pcVar1;
  int v;
  LogStream *pLVar2;
  allocator local_1d;
  int local_1c;
  char *pcStack_18;
  int line_local;
  char *fileName_local;
  Impl *this_local;
  
  local_1c = line;
  pcStack_18 = fileName;
  fileName_local = (char *)this;
  LogStream::LogStream(&this->stream_);
  pcVar1 = pcStack_18;
  this->line_ = local_1c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->basename_,pcVar1,&local_1d);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d);
  formatTime(this);
  pLVar2 = LogStream::operator<<(&this->stream_,"Thread ");
  v = CurrentThread::tid();
  pLVar2 = LogStream::operator<<(pLVar2,v);
  LogStream::operator<<(pLVar2,": ");
  return;
}

Assistant:

Logger::Impl::Impl(const char* fileName, int line)
    : stream_(),
      line_(line),
      basename_(fileName) {
    formatTime();
    stream_ << "Thread " << CurrentThread::tid() << ": ";
}